

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::auxBranchReactiveLoss(Graph *this,Vertex *v,double *sum)

{
  Edge **ppEVar1;
  Edge *pEVar2;
  double dVar3;
  
  ppEVar1 = &v->edgesList;
  do {
    pEVar2 = *ppEVar1;
    if (pEVar2 == (Edge *)0x0) {
      return;
    }
    while( true ) {
      if (pEVar2 == (Edge *)0x0) {
        return;
      }
      if (pEVar2->closed != false) break;
      pEVar2->activePowerFlow = 0.0;
      pEVar2->reactivePowerFlow = 0.0;
      pEVar2->activeLoss = 0.0;
      pEVar2->reactiveLoss = 0.0;
      pEVar2 = pEVar2->nextEdge;
    }
    dVar3 = Vertex::getReactivePower(pEVar2->destiny);
    *sum = dVar3 + pEVar2->reactiveLoss + *sum;
    auxBranchReactiveLoss(this,pEVar2->destiny,sum);
    ppEVar1 = &pEVar2->nextEdge;
  } while( true );
}

Assistant:

void Graph::auxBranchReactiveLoss(Vertex *v, double &sum){
    for(Edge *e = v->getEdgesList(); e!=NULL; e = e->getNext()){

        //nao descer por arcos com chave aberta
        while(e!=NULL && e->isClosed() == false){

            //nao tem fluxo nem perda em arcos abertos
            e->setActiveFlow(0.0);
            e->setReactiveFlow(0.0);
            e->setActiveLoss(0.0);
            e->setReactiveLoss(0.0);

            e = e->getNext();
        }
        if(e==NULL)
            break;

        sum+= e->getDestiny()->getReactivePower() + e->getReactiveLoss();
        auxBranchReactiveLoss(e->getDestiny(), sum);
    }
}